

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateCommand.h
# Opt level: O3

void __thiscall cmCTestUpdateCommand::~cmCTestUpdateCommand(cmCTestUpdateCommand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppcVar2;
  pointer pcVar3;
  
  (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand._vptr_cmCommand =
       (_func_int **)&PTR__cmCTestHandlerCommand_0069b0c8;
  ppcVar2 = (this->super_cmCTestHandlerCommand).Values.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar2 != (pointer)0x0) {
    operator_delete(ppcVar2,(long)(this->super_cmCTestHandlerCommand).Values.
                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar2)
    ;
  }
  ppcVar2 = (this->super_cmCTestHandlerCommand).Arguments.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar2 != (pointer)0x0) {
    operator_delete(ppcVar2,(long)(this->super_cmCTestHandlerCommand).Arguments.
                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar2)
    ;
  }
  pcVar3 = (this->super_cmCTestHandlerCommand).ReturnVariable._M_dataplus._M_p;
  paVar1 = &(this->super_cmCTestHandlerCommand).ReturnVariable.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand._vptr_cmCommand =
       (_func_int **)&PTR__cmCommand_0069cc68;
  pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Error.
           _M_dataplus._M_p;
  paVar1 = &(this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Error.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0xa8);
  return;
}

Assistant:

cmCTestUpdateCommand() {}